

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

bool __thiscall
Fossilize::FeatureFilter::Impl::graphics_pipeline_is_supported
          (Impl *this,VkGraphicsPipelineCreateInfo *info)

{
  uint uVar1;
  int iVar2;
  size_type sVar3;
  bool bVar4;
  uint local_698;
  allocator local_691;
  uint32_t i_2;
  allocator local_669;
  string local_668 [39];
  allocator local_641;
  string local_640 [39];
  allocator local_619;
  string local_618 [39];
  allocator local_5f1;
  string local_5f0 [39];
  allocator local_5c9;
  string local_5c8 [39];
  allocator local_5a1;
  string local_5a0 [39];
  allocator local_579;
  string local_578 [39];
  allocator local_551;
  string local_550 [39];
  allocator local_529;
  string local_528 [39];
  allocator local_501;
  string local_500 [39];
  allocator local_4d9;
  string local_4d8 [39];
  allocator local_4b1;
  string local_4b0 [39];
  allocator local_489;
  string local_488 [39];
  allocator local_461;
  string local_460 [39];
  allocator local_439;
  string local_438 [39];
  allocator local_411;
  string local_410 [39];
  allocator local_3e9;
  string local_3e8 [39];
  allocator local_3c1;
  string local_3c0 [39];
  allocator local_399;
  string local_398 [39];
  allocator local_371;
  string local_370 [39];
  allocator local_349;
  string local_348 [39];
  allocator local_321;
  string local_320 [39];
  allocator local_2f9;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [39];
  allocator local_259;
  string local_258 [39];
  allocator local_231;
  string local_230 [39];
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [39];
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [36];
  uint local_f4;
  long lStack_f0;
  uint32_t i_1;
  VkPipelineDynamicStateCreateInfo *dyn;
  undefined4 local_e0;
  uint32_t i;
  VkPipelineDepthStencilStateCreateFlags supported_ds_flags;
  uint32_t num_dynamic_states;
  VkDynamicState *dynamic_states;
  string local_c8 [37];
  byte local_a3;
  byte local_a2;
  allocator local_a1;
  string local_a0 [37];
  byte local_7b;
  byte local_7a;
  allocator local_79;
  string local_78 [37];
  byte local_53;
  byte local_52;
  allocator local_51;
  string local_50 [32];
  VkPipelineCreateFlagBits2KHR local_30;
  VkPipelineCreateFlagBits2KHR flags;
  VkPipelineCreateFlags2KHR supported_flags;
  VkGraphicsPipelineCreateInfo *info_local;
  Impl *this_local;
  
  flags = 0x446ee40ccf;
  supported_flags = (VkPipelineCreateFlags2KHR)info;
  info_local = (VkGraphicsPipelineCreateInfo *)this;
  local_30 = get_effective_flags<VkGraphicsPipelineCreateInfo>(info);
  if ((local_30 & 0xffffffbb911bf330) == 0) {
    if ((this->null_device & 1U) == 0) {
      if (((local_30 & 8) == 0) || (0x400fff < this->api_version)) {
        local_52 = 0;
        local_53 = 0;
        local_7a = 0;
        local_7b = 0;
        bVar4 = false;
        if ((local_30 & 0x200000) != 0) {
          std::allocator<char>::allocator();
          local_52 = 1;
          std::__cxx11::string::string(local_50,"VK_KHR_fragment_shading_rate",&local_51);
          local_53 = 1;
          sVar3 = std::
                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&this->enabled_extensions,(key_type *)local_50);
          bVar4 = true;
          if (sVar3 != 0) {
            std::allocator<char>::allocator();
            local_7a = 1;
            std::__cxx11::string::string(local_78,"VK_KHR_dynamic_rendering",&local_79);
            local_7b = 1;
            sVar3 = std::
                    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&this->enabled_extensions,(key_type *)local_78);
            bVar4 = sVar3 == 0;
          }
        }
        if ((local_7b & 1) != 0) {
          std::__cxx11::string::~string(local_78);
        }
        if ((local_7a & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_79);
        }
        if ((local_53 & 1) != 0) {
          std::__cxx11::string::~string(local_50);
        }
        if ((local_52 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_51);
        }
        if (bVar4) {
          this_local._7_1_ = false;
        }
        else {
          local_a2 = 0;
          local_a3 = 0;
          dynamic_states._6_1_ = 0;
          dynamic_states._5_1_ = 0;
          bVar4 = false;
          if ((local_30 & 0x400000) != 0) {
            std::allocator<char>::allocator();
            local_a2 = 1;
            std::__cxx11::string::string(local_a0,"VK_EXT_fragment_density_map",&local_a1);
            local_a3 = 1;
            sVar3 = std::
                    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&this->enabled_extensions,(key_type *)local_a0);
            bVar4 = true;
            if (sVar3 != 0) {
              std::allocator<char>::allocator();
              dynamic_states._6_1_ = 1;
              std::__cxx11::string::string
                        (local_c8,"VK_KHR_dynamic_rendering",
                         (allocator *)((long)&dynamic_states + 7));
              dynamic_states._5_1_ = 1;
              sVar3 = std::
                      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::count(&this->enabled_extensions,(key_type *)local_c8);
              bVar4 = sVar3 == 0;
            }
          }
          if ((dynamic_states._5_1_ & 1) != 0) {
            std::__cxx11::string::~string(local_c8);
          }
          if ((dynamic_states._6_1_ & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)((long)&dynamic_states + 7));
          }
          if ((local_a3 & 1) != 0) {
            std::__cxx11::string::~string(local_a0);
          }
          if ((local_a2 & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_a1);
          }
          if (bVar4) {
            this_local._7_1_ = false;
          }
          else if (((local_30 & 0x800c00) == 0) ||
                  ((this->features).graphics_pipeline_library.graphicsPipelineLibrary != 0)) {
            if (((local_30 & 0x20000000) == 0) ||
               ((this->features).descriptor_buffer.descriptorBuffer != 0)) {
              if (((local_30 & 0x6000000) == 0) ||
                 ((this->features).attachment_feedback_loop_layout.attachmentFeedbackLoopLayout != 0
                 )) {
                if (((local_30 & 0x40000) == 0) ||
                   ((this->features).device_generated_commands_nv.deviceGeneratedCommands != 0)) {
                  if (((local_30 & 0x48000000) == 0) ||
                     ((this->features).pipeline_protected_access.pipelineProtectedAccess != 0)) {
                    if (((local_30 & 0x400000000) == 0) ||
                       ((this->features).legacy_dithering.legacyDithering != 0)) {
                      if (((local_30 & 0x4000000000) == 0) ||
                         ((this->features).device_generated_commands.deviceGeneratedCommands != 0))
                      {
                        _supported_ds_flags = (VkDynamicState *)0x0;
                        i = 0;
                        if (*(long *)(supported_flags + 0x60) != 0) {
                          _supported_ds_flags =
                               *(VkDynamicState **)(*(long *)(supported_flags + 0x60) + 0x18);
                          i = *(uint32_t *)(*(long *)(supported_flags + 0x60) + 0x14);
                        }
                        if ((*(long *)(supported_flags + 0x58) == 0) ||
                           (bVar4 = pnext_chain_is_supported
                                              (this,*(void **)(*(long *)(supported_flags + 0x58) + 8
                                                              )), bVar4)) {
                          if ((*(long *)(supported_flags + 0x58) == 0) ||
                             (bVar4 = color_blend_state_is_supported
                                                (this,*(VkPipelineColorBlendStateCreateInfo **)
                                                       (supported_flags + 0x58),_supported_ds_flags,
                                                 i), bVar4)) {
                            if ((*(long *)(supported_flags + 0x20) == 0) ||
                               (bVar4 = pnext_chain_is_supported
                                                  (this,*(void **)(*(long *)(supported_flags + 0x20)
                                                                  + 8)), bVar4)) {
                              if ((*(long *)(supported_flags + 0x50) == 0) ||
                                 (bVar4 = pnext_chain_is_supported
                                                    (this,*(void **)(*(long *)(supported_flags +
                                                                              0x50) + 8)), bVar4)) {
                                if ((*(long *)(supported_flags + 0x28) == 0) ||
                                   (bVar4 = pnext_chain_is_supported
                                                      (this,*(void **)(*(long *)(supported_flags +
                                                                                0x28) + 8)), bVar4))
                                {
                                  if ((*(long *)(supported_flags + 0x60) == 0) ||
                                     (bVar4 = pnext_chain_is_supported
                                                        (this,*(void **)(*(long *)(supported_flags +
                                                                                  0x60) + 8)), bVar4
                                     )) {
                                    if ((*(long *)(supported_flags + 0x48) == 0) ||
                                       (bVar4 = pnext_chain_is_supported
                                                          (this,*(void **)(*(long *)(supported_flags
                                                                                    + 0x48) + 8)),
                                       bVar4)) {
                                      if ((*(long *)(supported_flags + 0x30) == 0) ||
                                         (bVar4 = pnext_chain_is_supported
                                                            (this,*(void **)(*(long *)(
                                                  supported_flags + 0x30) + 8)), bVar4)) {
                                        if ((*(long *)(supported_flags + 0x38) == 0) ||
                                           (bVar4 = pnext_chain_is_supported
                                                              (this,*(void **)(*(long *)(
                                                  supported_flags + 0x38) + 8)), bVar4)) {
                                          if ((*(long *)(supported_flags + 0x40) == 0) ||
                                             (bVar4 = pnext_chain_is_supported
                                                                (this,*(void **)(*(long *)(
                                                  supported_flags + 0x40) + 8)), bVar4)) {
                                            if (*(long *)(supported_flags + 0x40) != 0) {
                                              bVar4 = has_dynamic_state(_supported_ds_flags,i,
                                                                                                                                                
                                                  VK_DYNAMIC_STATE_POLYGON_MODE_EXT);
                                              if ((!bVar4) &&
                                                 (bVar4 = polygon_mode_is_supported
                                                                    (this,*(VkPolygonMode *)
                                                                           (*(long *)(
                                                  supported_flags + 0x40) + 0x1c)), !bVar4)) {
                                                return false;
                                              }
                                              bVar4 = has_dynamic_state(_supported_ds_flags,i,
                                                                                                                                                
                                                  VK_DYNAMIC_STATE_DEPTH_CLAMP_ENABLE_EXT);
                                              if (((!bVar4) &&
                                                  (*(int *)(*(long *)(supported_flags + 0x40) + 0x14
                                                           ) != 0)) &&
                                                 ((this->features2).features.depthClamp == 0)) {
                                                return false;
                                              }
                                            }
                                            if (*(long *)(supported_flags + 0x50) != 0) {
                                              local_e0 = 3;
                                              if ((*(uint *)(*(long *)(supported_flags + 0x50) +
                                                            0x10) & 0xfffffffc) != 0) {
                                                return false;
                                              }
                                              if (((*(uint *)(*(long *)(supported_flags + 0x50) +
                                                             0x10) & 1) != 0) &&
                                                 ((this->features).
                                                  rasterization_order_attachment_access.
                                                  rasterizationOrderDepthAttachmentAccess == 0)) {
                                                return false;
                                              }
                                              if (((*(uint *)(*(long *)(supported_flags + 0x50) +
                                                             0x10) & 2) != 0) &&
                                                 ((this->features).
                                                  rasterization_order_attachment_access.
                                                  rasterizationOrderStencilAttachmentAccess == 0)) {
                                                return false;
                                              }
                                            }
                                            if ((*(long *)(supported_flags + 0x70) == 0) &&
                                               ((this->features).dynamic_rendering.dynamicRendering
                                                == 0)) {
                                              this_local._7_1_ = false;
                                            }
                                            else {
                                              if (*(long *)(supported_flags + 0x20) != 0) {
                                                for (dyn._4_4_ = 0;
                                                    dyn._4_4_ <
                                                    *(uint *)(*(long *)(supported_flags + 0x20) +
                                                             0x20); dyn._4_4_ = dyn._4_4_ + 1) {
                                                  bVar4 = format_is_supported(this,*(VkFormat *)
                                                                                    (*(long *)(*(
                                                  long *)(supported_flags + 0x20) + 0x28) +
                                                  (ulong)dyn._4_4_ * 0x10 + 8),0x40);
                                                  if (!bVar4) {
                                                    return false;
                                                  }
                                                }
                                              }
                                              if (*(long *)(supported_flags + 0x60) != 0) {
                                                lStack_f0 = *(long *)(supported_flags + 0x60);
                                                for (local_f4 = 0;
                                                    local_f4 < *(uint *)(lStack_f0 + 0x14);
                                                    local_f4 = local_f4 + 1) {
                                                  uVar1 = *(uint *)(*(long *)(lStack_f0 + 0x18) +
                                                                   (ulong)local_f4 * 4);
                                                  if (8 < uVar1) {
                                                    if (uVar1 == 0x3b9c1dd8) {
                                                      std::allocator<char>::allocator();
                                                      std::__cxx11::string::string
                                                                (local_118,
                                                                 "VK_NV_clip_space_w_scaling",
                                                                 &local_119);
                                                      sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_118);
                                                  std::__cxx11::string::~string(local_118);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_119);
                                                  if (sVar3 == 0) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 + 0xc463b348 < 3) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_140,"VK_EXT_discard_rectangles"
                                                               ,&local_141);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_140);
                                                  std::__cxx11::string::~string(local_140);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_141);
                                                  if (sVar3 == 0) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3b9cf898) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_168,"VK_EXT_sample_locations",
                                                               &local_169);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_168);
                                                  std::__cxx11::string::~string(local_168);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_169);
                                                  if (sVar3 == 0) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3b9d4aa4) {
                                                    if ((this->features).shading_rate_nv.
                                                        shadingRateImage == 0) {
                                                      return false;
                                                    }
                                                  }
                                                  else if (uVar1 == 0x3b9d4aa6) {
                                                    if ((this->features).shading_rate_nv.
                                                        shadingRateCoarseSampleOrder == 0) {
                                                      return false;
                                                    }
                                                  }
                                                  else if (uVar1 + 0xc4621538 < 2) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_190,"VK_NV_scissor_exclusive",
                                                               &local_191);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_190);
                                                  std::__cxx11::string::~string(local_190);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_191);
                                                  if (sVar3 == 0) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3b9e3cd0) {
                                                    if ((this->features).fragment_shading_rate.
                                                        pipelineFragmentShadingRate == 0) {
                                                      return false;
                                                    }
                                                  }
                                                  else if (uVar1 == 0x3b9ebdb8) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_1b8,"VK_EXT_line_rasterization"
                                                               ,&local_1b9);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_1b8);
                                                  std::__cxx11::string::~string(local_1b8);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_1b9);
                                                  if (sVar3 == 0) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 + 0xc4612308 < 0xc) {
                                                    if (((this->features).extended_dynamic_state.
                                                         extendedDynamicState == 0) &&
                                                       (this->api_version < 0x403000)) {
                                                      return false;
                                                    }
                                                  }
                                                  else if (uVar1 == 0x3ba02900) {
                                                    if ((this->features).vertex_input_dynamic_state.
                                                        vertexInputDynamicState == 0) {
                                                      return false;
                                                    }
                                                  }
                                                  else if (uVar1 == 0x3ba08aa8) {
                                                    if ((this->features).extended_dynamic_state2.
                                                        extendedDynamicState2PatchControlPoints == 0
                                                       ) {
                                                      return false;
                                                    }
                                                  }
                                                  else if (uVar1 + 0xc45f7557 < 2) {
LAB_0012578a:
                                                    if (((this->features).extended_dynamic_state2.
                                                         extendedDynamicState2 == 0) &&
                                                       (this->api_version < 0x403000)) {
                                                      return false;
                                                    }
                                                  }
                                                  else if (uVar1 == 0x3ba08aab) {
                                                    if ((this->features).extended_dynamic_state2.
                                                        extendedDynamicState2LogicOp == 0) {
                                                      return false;
                                                    }
                                                  }
                                                  else {
                                                    if (uVar1 == 0x3ba08aac) goto LAB_0012578a;
                                                    if (uVar1 == 0x3ba09a48) {
                                                      if ((this->features).color_write_enable.
                                                          colorWriteEnable == 0) {
                                                        return false;
                                                      }
                                                    }
                                                    else if (uVar1 == 0x3ba1bb5a) {
                                                      std::allocator<char>::allocator();
                                                      std::__cxx11::string::string
                                                                (local_1e0,
                                                                 "VK_EXT_extended_dynamic_state3",
                                                                 &local_1e1);
                                                      sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_1e0);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .
                                                  extendedDynamicState3TessellationDomainOrigin == 0
                                                  ;
                                                  }
                                                  std::__cxx11::string::~string(local_1e0);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_1e1);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb5b) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_208,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_209);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_208);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .extendedDynamicState3DepthClampEnable
                                                            == 0;
                                                  }
                                                  std::__cxx11::string::~string(local_208);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_209);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb5c) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_230,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_231);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_230);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .extendedDynamicState3PolygonMode == 0;
                                                  }
                                                  std::__cxx11::string::~string(local_230);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_231);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb5d) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_258,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_259);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_258);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .
                                                  extendedDynamicState3RasterizationSamples == 0;
                                                  }
                                                  std::__cxx11::string::~string(local_258);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_259);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb5e) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_280,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_281);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_280);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .extendedDynamicState3SampleMask == 0;
                                                  }
                                                  std::__cxx11::string::~string(local_280);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_281);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb5f) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_2a8,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_2a9);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_2a8);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .
                                                  extendedDynamicState3AlphaToCoverageEnable == 0;
                                                  }
                                                  std::__cxx11::string::~string(local_2a8);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_2a9);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb60) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_2d0,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_2d1);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_2d0);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .extendedDynamicState3AlphaToOneEnable
                                                            == 0;
                                                  }
                                                  std::__cxx11::string::~string(local_2d0);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_2d1);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb61) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_2f8,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_2f9);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_2f8);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .extendedDynamicState3LogicOpEnable == 0
                                                    ;
                                                  }
                                                  std::__cxx11::string::~string(local_2f8);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_2f9);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb62) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_320,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_321);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_320);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .extendedDynamicState3ColorBlendEnable
                                                            == 0;
                                                  }
                                                  std::__cxx11::string::~string(local_320);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_321);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb63) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_348,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_349);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_348);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .extendedDynamicState3ColorBlendEquation
                                                            == 0;
                                                  }
                                                  std::__cxx11::string::~string(local_348);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_349);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb64) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_370,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_371);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_370);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .extendedDynamicState3ColorWriteMask ==
                                                            0;
                                                  }
                                                  std::__cxx11::string::~string(local_370);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_371);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb65) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_398,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_399);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_398);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .
                                                  extendedDynamicState3RasterizationStream == 0;
                                                  }
                                                  std::__cxx11::string::~string(local_398);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_399);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb66) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_3c0,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_3c1);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_3c0);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .
                                                  extendedDynamicState3ConservativeRasterizationMode
                                                  == 0;
                                                  }
                                                  std::__cxx11::string::~string(local_3c0);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_3c1);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb67) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_3e8,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_3e9);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_3e8);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .
                                                  extendedDynamicState3ExtraPrimitiveOverestimationSize
                                                  == 0;
                                                  }
                                                  std::__cxx11::string::~string(local_3e8);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_3e9);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb68) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_410,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_411);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_410);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .extendedDynamicState3DepthClipEnable ==
                                                            0;
                                                  }
                                                  std::__cxx11::string::~string(local_410);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_411);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb69) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_438,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_439);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_438);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .
                                                  extendedDynamicState3SampleLocationsEnable == 0;
                                                  }
                                                  std::__cxx11::string::~string(local_438);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_439);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb6a) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_460,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_461);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_460);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .extendedDynamicState3ColorBlendAdvanced
                                                            == 0;
                                                  }
                                                  std::__cxx11::string::~string(local_460);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_461);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb6b) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_488,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_489);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_488);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .
                                                  extendedDynamicState3ProvokingVertexMode == 0;
                                                  }
                                                  std::__cxx11::string::~string(local_488);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_489);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb6c) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_4b0,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_4b1);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_4b0);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .
                                                  extendedDynamicState3LineRasterizationMode == 0;
                                                  }
                                                  std::__cxx11::string::~string(local_4b0);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_4b1);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb6d) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_4d8,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_4d9);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_4d8);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .extendedDynamicState3LineStippleEnable
                                                            == 0;
                                                  }
                                                  std::__cxx11::string::~string(local_4d8);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_4d9);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb6e) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_500,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_501);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_500);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .
                                                  extendedDynamicState3DepthClipNegativeOneToOne ==
                                                  0;
                                                  }
                                                  std::__cxx11::string::~string(local_500);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_501);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb6f) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_528,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_529);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_528);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .
                                                  extendedDynamicState3ViewportWScalingEnable == 0;
                                                  }
                                                  std::__cxx11::string::~string(local_528);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_529);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb70) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_550,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_551);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_550);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .extendedDynamicState3ViewportSwizzle ==
                                                            0;
                                                  }
                                                  std::__cxx11::string::~string(local_550);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_551);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb71) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_578,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_579);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_578);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .
                                                  extendedDynamicState3CoverageToColorEnable == 0;
                                                  }
                                                  std::__cxx11::string::~string(local_578);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_579);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb72) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_5a0,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_5a1);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_5a0);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .
                                                  extendedDynamicState3CoverageToColorLocation == 0;
                                                  }
                                                  std::__cxx11::string::~string(local_5a0);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_5a1);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb73) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_5c8,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_5c9);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_5c8);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .
                                                  extendedDynamicState3CoverageModulationMode == 0;
                                                  }
                                                  std::__cxx11::string::~string(local_5c8);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_5c9);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb74) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_5f0,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_5f1);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_5f0);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .
                                                  extendedDynamicState3CoverageModulationTableEnable
                                                  == 0;
                                                  }
                                                  std::__cxx11::string::~string(local_5f0);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_5f1);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb75) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_618,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_619);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_618);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .
                                                  extendedDynamicState3CoverageModulationTable == 0;
                                                  }
                                                  std::__cxx11::string::~string(local_618);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_619);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb76) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_640,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_641);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_640);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .
                                                  extendedDynamicState3ShadingRateImageEnable == 0;
                                                  }
                                                  std::__cxx11::string::~string(local_640);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_641);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb77) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              (local_668,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_669);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,
                                                          (key_type *)local_668);
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .
                                                  extendedDynamicState3RepresentativeFragmentTestEnable
                                                  == 0;
                                                  }
                                                  std::__cxx11::string::~string(local_668);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_669);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba1bb78) {
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::string
                                                              ((string *)&i_2,
                                                               "VK_EXT_extended_dynamic_state3",
                                                               &local_691);
                                                    sVar3 = std::
                                                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::count(&this->enabled_extensions,(key_type *)&i_2
                                                         );
                                                  bVar4 = true;
                                                  if (sVar3 != 0) {
                                                    bVar4 = (this->features).extended_dynamic_state3
                                                            .
                                                  extendedDynamicState3CoverageReductionMode == 0;
                                                  }
                                                  std::__cxx11::string::~string((string *)&i_2);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_691);
                                                  if (bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else if (uVar1 == 0x3ba2c8e0) {
                                                    if ((this->features).
                                                        attachment_feedback_loop_dynamic_state.
                                                        attachmentFeedbackLoopDynamicState == 0) {
                                                      return false;
                                                    }
                                                  }
                                                  else {
                                                    if (uVar1 != 0x3ba3ab70) {
                                                      return false;
                                                    }
                                                    if ((this->features).depth_clamp_control.
                                                        depthClampControl == 0) {
                                                      return false;
                                                    }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                              for (local_698 = 0;
                                                  local_698 < *(uint *)(supported_flags + 0x14);
                                                  local_698 = local_698 + 1) {
                                                iVar2 = *(int *)(*(long *)(supported_flags + 0x18) +
                                                                 0x14 + (ulong)local_698 * 0x30);
                                                if (iVar2 != 1) {
                                                  if ((iVar2 == 2) || (iVar2 == 4)) {
                                                    if ((this->features2).features.
                                                        tessellationShader == 0) {
                                                      return false;
                                                    }
                                                  }
                                                  else if (iVar2 == 8) {
                                                    if ((this->features2).features.geometryShader ==
                                                        0) {
                                                      return false;
                                                    }
                                                  }
                                                  else if (iVar2 != 0x10) {
                                                    if (iVar2 == 0x20) {
                                                      return false;
                                                    }
                                                    if (iVar2 == 0x40) {
                                                      if (((this->features).mesh_shader.taskShader
                                                           == 0) &&
                                                         ((this->features).mesh_shader_nv.taskShader
                                                          == 0)) {
                                                        return false;
                                                      }
                                                      bVar4 = stage_limits_are_supported
                                                                        (this,(
                                                  VkPipelineShaderStageCreateInfo *)
                                                  (*(long *)(supported_flags + 0x18) +
                                                  (ulong)local_698 * 0x30));
                                                  if (!bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  else {
                                                    if (iVar2 != 0x80) {
                                                      return false;
                                                    }
                                                    if (((this->features).mesh_shader.meshShader ==
                                                         0) && ((this->features).mesh_shader_nv.
                                                                meshShader == 0)) {
                                                      return false;
                                                    }
                                                    bVar4 = stage_limits_are_supported
                                                                      (this,(
                                                  VkPipelineShaderStageCreateInfo *)
                                                  (*(long *)(supported_flags + 0x18) +
                                                  (ulong)local_698 * 0x30));
                                                  if (!bVar4) {
                                                    return false;
                                                  }
                                                  }
                                                  }
                                                }
                                                bVar4 = subgroup_size_control_is_supported
                                                                  (this,(
                                                  VkPipelineShaderStageCreateInfo *)
                                                  (*(long *)(supported_flags + 0x18) +
                                                  (ulong)local_698 * 0x30));
                                                if (!bVar4) {
                                                  return false;
                                                }
                                                bVar4 = pnext_chain_is_supported
                                                                  (this,*(void **)(*(long *)(
                                                  supported_flags + 0x18) + (ulong)local_698 * 0x30
                                                  + 8));
                                                if (!bVar4) {
                                                  return false;
                                                }
                                              }
                                              this_local._7_1_ =
                                                   pnext_chain_is_supported
                                                             (this,*(void **)(supported_flags + 8));
                                            }
                                          }
                                          else {
                                            this_local._7_1_ = false;
                                          }
                                        }
                                        else {
                                          this_local._7_1_ = false;
                                        }
                                      }
                                      else {
                                        this_local._7_1_ = false;
                                      }
                                    }
                                    else {
                                      this_local._7_1_ = false;
                                    }
                                  }
                                  else {
                                    this_local._7_1_ = false;
                                  }
                                }
                                else {
                                  this_local._7_1_ = false;
                                }
                              }
                              else {
                                this_local._7_1_ = false;
                              }
                            }
                            else {
                              this_local._7_1_ = false;
                            }
                          }
                          else {
                            this_local._7_1_ = false;
                          }
                        }
                        else {
                          this_local._7_1_ = false;
                        }
                      }
                      else {
                        this_local._7_1_ = false;
                      }
                    }
                    else {
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    this_local._7_1_ = false;
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FeatureFilter::Impl::graphics_pipeline_is_supported(const VkGraphicsPipelineCreateInfo *info) const
{
	// Only allow flags we recognize and validate.
	constexpr VkPipelineCreateFlags2KHR supported_flags =
			VK_PIPELINE_CREATE_DISABLE_OPTIMIZATION_BIT |
			VK_PIPELINE_CREATE_ALLOW_DERIVATIVES_BIT |
			VK_PIPELINE_CREATE_DERIVATIVE_BIT |
			VK_PIPELINE_CREATE_RENDERING_FRAGMENT_DENSITY_MAP_ATTACHMENT_BIT_EXT |
			VK_PIPELINE_CREATE_VIEW_INDEX_FROM_DEVICE_INDEX_BIT |
			VK_PIPELINE_CREATE_RENDERING_FRAGMENT_SHADING_RATE_ATTACHMENT_BIT_KHR |
			VK_PIPELINE_CREATE_CAPTURE_INTERNAL_REPRESENTATIONS_BIT_KHR |
			VK_PIPELINE_CREATE_CAPTURE_STATISTICS_BIT_KHR |
			VK_PIPELINE_CREATE_LIBRARY_BIT_KHR |
			VK_PIPELINE_CREATE_LINK_TIME_OPTIMIZATION_BIT_EXT |
			VK_PIPELINE_CREATE_RETAIN_LINK_TIME_OPTIMIZATION_INFO_BIT_EXT |
			VK_PIPELINE_CREATE_DESCRIPTOR_BUFFER_BIT_EXT |
			VK_PIPELINE_CREATE_COLOR_ATTACHMENT_FEEDBACK_LOOP_BIT_EXT |
			VK_PIPELINE_CREATE_DEPTH_STENCIL_ATTACHMENT_FEEDBACK_LOOP_BIT_EXT |
			VK_PIPELINE_CREATE_INDIRECT_BINDABLE_BIT_NV |
			VK_PIPELINE_CREATE_PROTECTED_ACCESS_ONLY_BIT_EXT |
			VK_PIPELINE_CREATE_NO_PROTECTED_ACCESS_BIT_EXT |
			VK_PIPELINE_CREATE_2_ENABLE_LEGACY_DITHERING_BIT_EXT |
			VK_PIPELINE_CREATE_2_INDIRECT_BINDABLE_BIT_EXT;

	auto flags = get_effective_flags(info);

	if ((flags & ~supported_flags) != 0)
		return false;

	if (null_device)
		return true;

	if ((flags & VK_PIPELINE_CREATE_VIEW_INDEX_FROM_DEVICE_INDEX_BIT) != 0 &&
	    api_version < VK_API_VERSION_1_1)
	{
		return false;
	}

	if ((flags & VK_PIPELINE_CREATE_RENDERING_FRAGMENT_SHADING_RATE_ATTACHMENT_BIT_KHR) != 0 &&
	    (enabled_extensions.count(VK_KHR_FRAGMENT_SHADING_RATE_EXTENSION_NAME) == 0 ||
	     enabled_extensions.count(VK_KHR_DYNAMIC_RENDERING_EXTENSION_NAME) == 0))
	{
		return false;
	}

	if ((flags & VK_PIPELINE_CREATE_RENDERING_FRAGMENT_DENSITY_MAP_ATTACHMENT_BIT_EXT) != 0 &&
	    (enabled_extensions.count(VK_EXT_FRAGMENT_DENSITY_MAP_EXTENSION_NAME) == 0 ||
	     enabled_extensions.count(VK_KHR_DYNAMIC_RENDERING_EXTENSION_NAME) == 0))
	{
		return false;
	}

	if ((flags & (VK_PIPELINE_CREATE_LIBRARY_BIT_KHR |
	              VK_PIPELINE_CREATE_LINK_TIME_OPTIMIZATION_BIT_EXT |
	              VK_PIPELINE_CREATE_RETAIN_LINK_TIME_OPTIMIZATION_INFO_BIT_EXT)) != 0 &&
	    features.graphics_pipeline_library.graphicsPipelineLibrary == VK_FALSE)
	{
		return false;
	}

	if ((flags & VK_PIPELINE_CREATE_DESCRIPTOR_BUFFER_BIT_EXT) != 0)
		if (!features.descriptor_buffer.descriptorBuffer)
			return false;

	if ((flags & (VK_PIPELINE_CREATE_COLOR_ATTACHMENT_FEEDBACK_LOOP_BIT_EXT |
	              VK_PIPELINE_CREATE_DEPTH_STENCIL_ATTACHMENT_FEEDBACK_LOOP_BIT_EXT)) != 0)
	{
		if (!features.attachment_feedback_loop_layout.attachmentFeedbackLoopLayout)
			return false;
	}

	if ((flags & VK_PIPELINE_CREATE_INDIRECT_BINDABLE_BIT_NV) != 0 &&
	    features.device_generated_commands_nv.deviceGeneratedCommands == VK_FALSE)
		return false;

	if ((flags & (VK_PIPELINE_CREATE_PROTECTED_ACCESS_ONLY_BIT_EXT |
	              VK_PIPELINE_CREATE_NO_PROTECTED_ACCESS_BIT_EXT)) != 0 &&
	    features.pipeline_protected_access.pipelineProtectedAccess == VK_FALSE)
		return false;

	if ((flags & VK_PIPELINE_CREATE_2_ENABLE_LEGACY_DITHERING_BIT_EXT) != 0 &&
	    features.legacy_dithering.legacyDithering == VK_FALSE)
		return false;

	if ((flags & VK_PIPELINE_CREATE_2_INDIRECT_BINDABLE_BIT_EXT) != 0 &&
	    features.device_generated_commands.deviceGeneratedCommands == VK_FALSE)
		return false;

	const VkDynamicState *dynamic_states = nullptr;
	uint32_t num_dynamic_states = 0;

	if (info->pDynamicState)
	{
		dynamic_states = info->pDynamicState->pDynamicStates;
		num_dynamic_states = info->pDynamicState->dynamicStateCount;
	}

	if (info->pColorBlendState && !pnext_chain_is_supported(info->pColorBlendState->pNext))
		return false;

	if (info->pColorBlendState && !color_blend_state_is_supported(
			info->pColorBlendState, dynamic_states, num_dynamic_states))
		return false;

	if (info->pVertexInputState && !pnext_chain_is_supported(info->pVertexInputState->pNext))
		return false;
	if (info->pDepthStencilState && !pnext_chain_is_supported(info->pDepthStencilState->pNext))
		return false;
	if (info->pInputAssemblyState && !pnext_chain_is_supported(info->pInputAssemblyState->pNext))
		return false;
	if (info->pDynamicState && !pnext_chain_is_supported(info->pDynamicState->pNext))
		return false;
	if (info->pMultisampleState && !pnext_chain_is_supported(info->pMultisampleState->pNext))
		return false;
	if (info->pTessellationState && !pnext_chain_is_supported(info->pTessellationState->pNext))
		return false;
	if (info->pViewportState && !pnext_chain_is_supported(info->pViewportState->pNext))
		return false;
	if (info->pRasterizationState && !pnext_chain_is_supported(info->pRasterizationState->pNext))
		return false;

	if (info->pRasterizationState)
	{
		if (!has_dynamic_state(dynamic_states, num_dynamic_states, VK_DYNAMIC_STATE_POLYGON_MODE_EXT) &&
		    !polygon_mode_is_supported(info->pRasterizationState->polygonMode))
			return false;

		if (!has_dynamic_state(dynamic_states, num_dynamic_states, VK_DYNAMIC_STATE_DEPTH_CLAMP_ENABLE_EXT) &&
		    info->pRasterizationState->depthClampEnable && features2.features.depthClamp == VK_FALSE)
			return false;
	}

	if (info->pDepthStencilState)
	{
		constexpr VkPipelineDepthStencilStateCreateFlags supported_ds_flags =
				VK_PIPELINE_DEPTH_STENCIL_STATE_CREATE_RASTERIZATION_ORDER_ATTACHMENT_DEPTH_ACCESS_BIT_EXT |
				VK_PIPELINE_DEPTH_STENCIL_STATE_CREATE_RASTERIZATION_ORDER_ATTACHMENT_STENCIL_ACCESS_BIT_EXT;

		if (info->pDepthStencilState->flags & ~supported_ds_flags)
			return false;

		if ((info->pDepthStencilState->flags &
		     VK_PIPELINE_DEPTH_STENCIL_STATE_CREATE_RASTERIZATION_ORDER_ATTACHMENT_DEPTH_ACCESS_BIT_EXT) != 0 &&
		    features.rasterization_order_attachment_access.rasterizationOrderDepthAttachmentAccess == VK_FALSE)
			return false;

		if ((info->pDepthStencilState->flags &
		     VK_PIPELINE_DEPTH_STENCIL_STATE_CREATE_RASTERIZATION_ORDER_ATTACHMENT_STENCIL_ACCESS_BIT_EXT) != 0 &&
		    features.rasterization_order_attachment_access.rasterizationOrderStencilAttachmentAccess == VK_FALSE)
			return false;
	}

	if (info->renderPass == VK_NULL_HANDLE && features.dynamic_rendering.dynamicRendering == VK_FALSE)
		return false;

	if (info->pVertexInputState)
	{
		for (uint32_t i = 0; i < info->pVertexInputState->vertexAttributeDescriptionCount; i++)
		{
			if (!format_is_supported(info->pVertexInputState->pVertexAttributeDescriptions[i].format,
			                         VK_FORMAT_FEATURE_VERTEX_BUFFER_BIT))
				return false;
		}
	}

	if (info->pDynamicState)
	{
		auto &dyn = *info->pDynamicState;
		for (uint32_t i = 0; i < dyn.dynamicStateCount; i++)
		{
			switch (dyn.pDynamicStates[i])
			{
			case VK_DYNAMIC_STATE_CULL_MODE_EXT:
			case VK_DYNAMIC_STATE_FRONT_FACE_EXT:
			case VK_DYNAMIC_STATE_PRIMITIVE_TOPOLOGY_EXT:
			case VK_DYNAMIC_STATE_VIEWPORT_WITH_COUNT_EXT:
			case VK_DYNAMIC_STATE_SCISSOR_WITH_COUNT_EXT:
			case VK_DYNAMIC_STATE_VERTEX_INPUT_BINDING_STRIDE_EXT:
			case VK_DYNAMIC_STATE_DEPTH_TEST_ENABLE_EXT:
			case VK_DYNAMIC_STATE_DEPTH_WRITE_ENABLE_EXT:
			case VK_DYNAMIC_STATE_DEPTH_COMPARE_OP_EXT:
			case VK_DYNAMIC_STATE_DEPTH_BOUNDS_TEST_ENABLE_EXT:
			case VK_DYNAMIC_STATE_STENCIL_TEST_ENABLE_EXT:
			case VK_DYNAMIC_STATE_STENCIL_OP_EXT:
				if (!features.extended_dynamic_state.extendedDynamicState && api_version < VK_API_VERSION_1_3)
					return false;
				break;

			case VK_DYNAMIC_STATE_PATCH_CONTROL_POINTS_EXT:
				if (!features.extended_dynamic_state2.extendedDynamicState2PatchControlPoints)
					return false;
				break;

			case VK_DYNAMIC_STATE_LOGIC_OP_EXT:
				if (!features.extended_dynamic_state2.extendedDynamicState2LogicOp)
					return false;
				break;

			case VK_DYNAMIC_STATE_RASTERIZER_DISCARD_ENABLE_EXT:
			case VK_DYNAMIC_STATE_DEPTH_BIAS_ENABLE_EXT:
			case VK_DYNAMIC_STATE_PRIMITIVE_RESTART_ENABLE_EXT:
				if (!features.extended_dynamic_state2.extendedDynamicState2 && api_version < VK_API_VERSION_1_3)
					return false;
				break;

			case VK_DYNAMIC_STATE_COLOR_WRITE_ENABLE_EXT:
				if (!features.color_write_enable.colorWriteEnable)
					return false;
				break;

			case VK_DYNAMIC_STATE_VERTEX_INPUT_EXT:
				if (!features.vertex_input_dynamic_state.vertexInputDynamicState)
					return false;
				break;

			case VK_DYNAMIC_STATE_FRAGMENT_SHADING_RATE_KHR:
				// Only support dynamic fragment shading rate for now.
				// pNext variant needs to validate against vkGetPhysicalDeviceFragmentShadingRatesKHR on top.
				if (features.fragment_shading_rate.pipelineFragmentShadingRate == VK_FALSE)
					return false;
				break;

			case VK_DYNAMIC_STATE_VIEWPORT_W_SCALING_NV:
				if (!enabled_extensions.count(VK_NV_CLIP_SPACE_W_SCALING_EXTENSION_NAME))
					return false;
				break;

			case VK_DYNAMIC_STATE_DISCARD_RECTANGLE_EXT:
				// Technically we have to check v2, but whatever.
			case VK_DYNAMIC_STATE_DISCARD_RECTANGLE_MODE_EXT:
			case VK_DYNAMIC_STATE_DISCARD_RECTANGLE_ENABLE_EXT:
				if (!enabled_extensions.count(VK_EXT_DISCARD_RECTANGLES_EXTENSION_NAME))
					return false;
				break;

			case VK_DYNAMIC_STATE_SAMPLE_LOCATIONS_EXT:
				if (!enabled_extensions.count(VK_EXT_SAMPLE_LOCATIONS_EXTENSION_NAME))
					return false;
				break;

			case VK_DYNAMIC_STATE_VIEWPORT_SHADING_RATE_PALETTE_NV:
				if (!features.shading_rate_nv.shadingRateImage)
					return false;
				break;

			case VK_DYNAMIC_STATE_VIEWPORT_COARSE_SAMPLE_ORDER_NV:
				if (!features.shading_rate_nv.shadingRateCoarseSampleOrder)
					return false;
				break;

			case VK_DYNAMIC_STATE_EXCLUSIVE_SCISSOR_NV:
				// Technically this is part of v2, but whatever.
			case VK_DYNAMIC_STATE_EXCLUSIVE_SCISSOR_ENABLE_NV:
				if (!enabled_extensions.count(VK_NV_SCISSOR_EXCLUSIVE_EXTENSION_NAME))
					return false;
				break;

			case VK_DYNAMIC_STATE_LINE_STIPPLE_EXT:
				if (!enabled_extensions.count(VK_EXT_LINE_RASTERIZATION_EXTENSION_NAME))
					return false;
				break;

#define DYN_STATE3(state, member) case VK_DYNAMIC_STATE_##state: \
	if (!enabled_extensions.count(VK_EXT_EXTENDED_DYNAMIC_STATE_3_EXTENSION_NAME) || \
			features.extended_dynamic_state3.extendedDynamicState3##member == VK_FALSE) \
		return false; \
	break

			DYN_STATE3(TESSELLATION_DOMAIN_ORIGIN_EXT, TessellationDomainOrigin);
			DYN_STATE3(DEPTH_CLAMP_ENABLE_EXT, DepthClampEnable);
			DYN_STATE3(POLYGON_MODE_EXT, PolygonMode);
			DYN_STATE3(RASTERIZATION_SAMPLES_EXT, RasterizationSamples);
			DYN_STATE3(SAMPLE_MASK_EXT, SampleMask);
			DYN_STATE3(ALPHA_TO_COVERAGE_ENABLE_EXT, AlphaToCoverageEnable);
			DYN_STATE3(ALPHA_TO_ONE_ENABLE_EXT, AlphaToOneEnable);
			DYN_STATE3(LOGIC_OP_ENABLE_EXT, LogicOpEnable);
			DYN_STATE3(COLOR_BLEND_ENABLE_EXT, ColorBlendEnable);
			DYN_STATE3(COLOR_BLEND_EQUATION_EXT, ColorBlendEquation);
			DYN_STATE3(COLOR_WRITE_MASK_EXT, ColorWriteMask);
			DYN_STATE3(RASTERIZATION_STREAM_EXT, RasterizationStream);
			DYN_STATE3(CONSERVATIVE_RASTERIZATION_MODE_EXT, ConservativeRasterizationMode);
			DYN_STATE3(EXTRA_PRIMITIVE_OVERESTIMATION_SIZE_EXT, ExtraPrimitiveOverestimationSize);
			DYN_STATE3(DEPTH_CLIP_ENABLE_EXT, DepthClipEnable);
			DYN_STATE3(SAMPLE_LOCATIONS_ENABLE_EXT, SampleLocationsEnable);
			DYN_STATE3(COLOR_BLEND_ADVANCED_EXT, ColorBlendAdvanced);
			DYN_STATE3(PROVOKING_VERTEX_MODE_EXT, ProvokingVertexMode);
			DYN_STATE3(LINE_RASTERIZATION_MODE_EXT, LineRasterizationMode);
			DYN_STATE3(LINE_STIPPLE_ENABLE_EXT, LineStippleEnable);
			DYN_STATE3(DEPTH_CLIP_NEGATIVE_ONE_TO_ONE_EXT, DepthClipNegativeOneToOne);
			DYN_STATE3(VIEWPORT_W_SCALING_ENABLE_NV, ViewportWScalingEnable);
			DYN_STATE3(VIEWPORT_SWIZZLE_NV, ViewportSwizzle);
			DYN_STATE3(COVERAGE_TO_COLOR_ENABLE_NV, CoverageToColorEnable);
			DYN_STATE3(COVERAGE_TO_COLOR_LOCATION_NV, CoverageToColorLocation);
			DYN_STATE3(COVERAGE_MODULATION_MODE_NV, CoverageModulationMode);
			DYN_STATE3(COVERAGE_MODULATION_TABLE_ENABLE_NV, CoverageModulationTableEnable);
			DYN_STATE3(COVERAGE_MODULATION_TABLE_NV, CoverageModulationTable);
			DYN_STATE3(SHADING_RATE_IMAGE_ENABLE_NV, ShadingRateImageEnable);
			DYN_STATE3(REPRESENTATIVE_FRAGMENT_TEST_ENABLE_NV, RepresentativeFragmentTestEnable);
			DYN_STATE3(COVERAGE_REDUCTION_MODE_NV, CoverageReductionMode);
#undef DYN_STATE3

			case VK_DYNAMIC_STATE_ATTACHMENT_FEEDBACK_LOOP_ENABLE_EXT:
				if (features.attachment_feedback_loop_dynamic_state.attachmentFeedbackLoopDynamicState == VK_FALSE)
					return false;
				break;

			case VK_DYNAMIC_STATE_DEPTH_CLAMP_RANGE_EXT:
				if (features.depth_clamp_control.depthClampControl == VK_FALSE)
					return false;
				break;

			case VK_DYNAMIC_STATE_VIEWPORT:
			case VK_DYNAMIC_STATE_SCISSOR:
			case VK_DYNAMIC_STATE_LINE_WIDTH:
			case VK_DYNAMIC_STATE_DEPTH_BIAS:
			case VK_DYNAMIC_STATE_BLEND_CONSTANTS:
			case VK_DYNAMIC_STATE_DEPTH_BOUNDS:
			case VK_DYNAMIC_STATE_STENCIL_COMPARE_MASK:
			case VK_DYNAMIC_STATE_STENCIL_WRITE_MASK:
			case VK_DYNAMIC_STATE_STENCIL_REFERENCE:
				// Part of core.
				break;

			default:
				// Unrecognized dynamic state, we almost certainly have not enabled the feature.
				return false;
			}
		}
	}

	for (uint32_t i = 0; i < info->stageCount; i++)
	{
		switch (info->pStages[i].stage)
		{
		case VK_SHADER_STAGE_VERTEX_BIT:
		case VK_SHADER_STAGE_FRAGMENT_BIT:
			break;

		case VK_SHADER_STAGE_COMPUTE_BIT:
			return false;

		case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
		case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
			if (!features2.features.tessellationShader)
				return false;
			break;

		case VK_SHADER_STAGE_GEOMETRY_BIT:
			if (!features2.features.geometryShader)
				return false;
			break;

		case VK_SHADER_STAGE_MESH_BIT_EXT:
			if (!features.mesh_shader.meshShader && !features.mesh_shader_nv.meshShader)
				return false;
			if (!stage_limits_are_supported(info->pStages[i]))
				return false;
			break;

		case VK_SHADER_STAGE_TASK_BIT_EXT:
			if (!features.mesh_shader.taskShader && !features.mesh_shader_nv.taskShader)
				return false;
			if (!stage_limits_are_supported(info->pStages[i]))
				return false;
			break;

		default:
			return false;
		}

		if (!subgroup_size_control_is_supported(info->pStages[i]))
			return false;
		if (!pnext_chain_is_supported(info->pStages[i].pNext))
			return false;
	}

	return pnext_chain_is_supported(info->pNext);
}